

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O0

int __thiscall
actorpp::detail::ActorImpl::
wait<std::vector<unsigned_char,std::allocator<unsigned_char>>,actorpp::CloseReason>
          (ActorImpl *this,Channel<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *c,
          Channel<actorpp::CloseReason> *c_1)

{
  anon_class_24_3_4e947749 __p;
  int local_34;
  undefined1 local_30 [4];
  int i;
  unique_lock<std::mutex> lock;
  Channel<actorpp::CloseReason> *c_local_1;
  Channel<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *c_local;
  ActorImpl *this_local;
  
  lock._8_8_ = c_1;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_30,&this->mut);
  __p.c = c;
  __p.i = &local_34;
  __p._16_1_ = lock._M_owns;
  __p._17_7_ = lock._9_7_;
  std::condition_variable::
  wait<actorpp::detail::ActorImpl::wait<std::vector<unsigned_char,std::allocator<unsigned_char>>,actorpp::CloseReason>(actorpp::Channel<std::vector<unsigned_char,std::allocator<unsigned_char>>>&,actorpp::Channel<actorpp::CloseReason>&)::_lambda()_1_>
            (&this->cv,(unique_lock<std::mutex> *)local_30,__p);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_30);
  return local_34;
}

Assistant:

int wait(Channel<T> &...c) {
    std::unique_lock<std::mutex> lock(mut);
    int i;
    cv.wait(lock,
            [&]() { return (i = detail::readable_channel(0, c...)) != -1; });
    return i;
  }